

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O3

void __thiscall
cimod::BinaryPolynomialModel<int,_double>::AddInteraction
          (BinaryPolynomialModel<int,_double> *this,vector<int,_std::allocator<int>_> *key,
          double *value,Vartype vartype)

{
  vector<int,_std::allocator<int>_> copied_key;
  vector<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_38,key);
  AddInteraction(this,&local_38,value,vartype);
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AddInteraction( const std::vector<IndexType> &key, const FloatType &value, const Vartype vartype = Vartype::NONE ) {
      std::vector<IndexType> copied_key = key;
      AddInteraction( copied_key, value, vartype );
    }